

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::parse_hex::test_method(parse_hex *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator pvVar2;
  iterator in_R9;
  undefined ***pppuVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string_view hex_str;
  const_string file_03;
  string_view str;
  const_string file_04;
  string_view hex_str_00;
  const_string file_05;
  string_view str_00;
  const_string file_06;
  string_view hex_str_01;
  const_string file_07;
  string_view str_01;
  const_string file_08;
  string_view hex_str_02;
  const_string file_09;
  string_view str_02;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  string_view hex_str_03;
  const_string file_16;
  string_view str_03;
  const_string file_17;
  const_string file_18;
  string_view hex_str_04;
  const_string file_19;
  string_view str_04;
  const_string file_20;
  string_view hex_str_05;
  const_string file_21;
  string_view str_05;
  const_string file_22;
  string_view hex_str_06;
  const_string file_23;
  string_view str_06;
  check_type cVar4;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined8 local_570;
  char *local_568;
  assertion_result local_560;
  undefined8 *local_548;
  assertion_result local_540;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  vector<std::byte,_std::allocator<std::byte>_> hex_literal_vector;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  undefined1 local_100 [16];
  shared_count local_f0;
  char *local_e8;
  string with_embedded_null;
  array<unsigned_char,_65UL> hex_literal_array_uint8;
  uchar local_7f [6];
  array<std::byte,_65UL> hex_literal_array;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,HEX_PARSE_OUTPUT,
             &DAT_00c71241,(allocator_type *)&hex_literal_array);
  memcpy(&hex_literal_array,&DAT_00c71241,0x41);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x9f;
  file.m_begin = (iterator)&local_140;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&with_embedded_null,(equal_coll_impl *)local_100,
             hex_literal_array._M_elems,(uchar *)&local_38,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  hex_literal_array_uint8._M_elems[8] = '\0';
  hex_literal_array_uint8._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  hex_literal_array_uint8._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hex_literal_array_uint8._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_158 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&with_embedded_null,(lazy_ostream *)&hex_literal_array_uint8,1,0xd,
             4,0xc68be7,(size_t)&local_160,0x9f,"hex_literal_span.end()","expected.begin()",
             "expected.end()");
  boost::detail::shared_count::~shared_count
            ((shared_count *)&with_embedded_null.field_2._M_allocated_capacity);
  util::hex_literals::
  operator___hex_v<util::hex_literals::detail::Hex<131UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0xa3;
  file_00.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&with_embedded_null,(equal_coll_impl *)local_100,
             hex_literal_vector.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start,
             hex_literal_vector.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  hex_literal_array_uint8._M_elems[8] = '\0';
  hex_literal_array_uint8._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  hex_literal_array_uint8._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hex_literal_array_uint8._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&with_embedded_null,(lazy_ostream *)&hex_literal_array_uint8,1,0xd,
             4,0xc68be7,(size_t)&local_1a8,0xa3,"hex_literal_span.end()","expected.begin()",
             "expected.end()");
  boost::detail::shared_count::~shared_count
            ((shared_count *)&with_embedded_null.field_2._M_allocated_capacity);
  memcpy(&hex_literal_array_uint8,&DAT_00c71282,0x41);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0xa6;
  file_01.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
             hex_literal_array_uint8._M_elems,local_7f,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  with_embedded_null._M_string_length._0_1_ = 0;
  with_embedded_null._M_dataplus._M_p = "<W\x1b";
  with_embedded_null.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
  ;
  with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xc68c17,
             (size_t)&local_1d8,0xa6,"hex_literal_array_uint8.end()","expected.begin()",
             "expected.end()");
  boost::detail::shared_count::~shared_count(&local_f0);
  util::hex_literals::
  operator___hex_v_u8<util::hex_literals::detail::Hex<131UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&result,&with_embedded_null);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0xa9;
  file_02.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f8,
             msg_02);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  with_embedded_null._M_string_length._0_1_ = 0;
  with_embedded_null._M_dataplus._M_p = "<W\x1b";
  with_embedded_null.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
  ;
  with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xb582b0,
             (size_t)&local_208,0xa9,"result.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_f0);
  hex_str._M_str = HEX_PARSE_INPUT;
  hex_str._M_len = 0x82;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null,hex_str);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&result,&with_embedded_null);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0xac;
  file_03.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_228,
             msg_03);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  with_embedded_null._M_string_length._0_1_ = 0;
  with_embedded_null._M_dataplus._M_p = "<W\x1b";
  with_embedded_null.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
  ;
  with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_230 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xb582b0,
             (size_t)&local_238,0xac,"result.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_f0);
  str._M_str = HEX_PARSE_INPUT;
  str._M_len = 0x82;
  TryParseHex<unsigned_char>
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &with_embedded_null,str);
  if (with_embedded_null.field_2._M_local_buf[8] == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&result,&with_embedded_null);
    std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &with_embedded_null);
    local_248 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_240 = "";
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar2;
    msg_04.m_begin = pvVar1;
    file_04.m_end = (iterator)0xaf;
    file_04.m_begin = (iterator)&local_248;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_258,
               msg_04);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    with_embedded_null._M_string_length._0_1_ = 0;
    with_embedded_null._M_dataplus._M_p = "<W\x1b";
    with_embedded_null.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_260 = "";
    pvVar1 = &DAT_00000001;
    pvVar2 = (iterator)0xd;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xb582b0,
               (size_t)&local_268,0xaf,"result.end()","expected.begin()","expected.end()");
    boost::detail::shared_count::~shared_count(&local_f0);
    with_embedded_null._M_dataplus._M_p._0_4_ = 0x78563412;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,&with_embedded_null)
    ;
    hex_str_00._M_str = "12 34 56 78";
    hex_str_00._M_len = 0xb;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null,
               hex_str_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&result,&with_embedded_null);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null);
    local_278 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_270 = "";
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar2;
    msg_05.m_begin = pvVar1;
    file_05.m_end = (iterator)0xb4;
    file_05.m_begin = (iterator)&local_278;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_288,
               msg_05);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    with_embedded_null._M_string_length._0_1_ = 0;
    with_embedded_null._M_dataplus._M_p = "<W\x1b";
    with_embedded_null.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_298 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_290 = "";
    pvVar1 = &DAT_00000001;
    pvVar2 = (iterator)0xd;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xb582b0,
               (size_t)&local_298,0xb4,"result.end()","expected.begin()","expected.end()");
    boost::detail::shared_count::~shared_count(&local_f0);
    str_00._M_str = "12 34 56 78";
    str_00._M_len = 0xb;
    TryParseHex<unsigned_char>
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &with_embedded_null,str_00);
    if (with_embedded_null.field_2._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&result,&with_embedded_null);
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&with_embedded_null);
      local_2a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_2a0 = "";
      local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_06.m_end = pvVar2;
      msg_06.m_begin = pvVar1;
      file_06.m_end = (iterator)0xb6;
      file_06.m_begin = (iterator)&local_2a8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b8,
                 msg_06);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      with_embedded_null._M_string_length._0_1_ = 0;
      with_embedded_null._M_dataplus._M_p = "<W\x1b";
      with_embedded_null.field_2._M_allocated_capacity =
           (size_type)boost::unit_test::lazy_ostream::inst;
      with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_2c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_2c0 = "";
      pvVar1 = &DAT_00000001;
      pvVar2 = (iterator)0xd;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xb582b0,
                 (size_t)&local_2c8,0xb6,"result.end()","expected.begin()","expected.end()");
      boost::detail::shared_count::~shared_count(&local_f0);
      with_embedded_null._M_dataplus._M_p._0_4_ = 0x78563489;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,
                 &with_embedded_null);
      hex_str_01._M_str = " 89 34 56 78";
      hex_str_01._M_len = 0xc;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null,
                 hex_str_01);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&result,&with_embedded_null);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null)
      ;
      local_2d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_2d0 = "";
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_07.m_end = pvVar2;
      msg_07.m_begin = pvVar1;
      file_07.m_end = (iterator)0xbb;
      file_07.m_begin = (iterator)&local_2d8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e8,
                 msg_07);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      with_embedded_null._M_string_length._0_1_ = 0;
      with_embedded_null._M_dataplus._M_p = "<W\x1b";
      with_embedded_null.field_2._M_allocated_capacity =
           (size_type)boost::unit_test::lazy_ostream::inst;
      with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_2f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_2f0 = "";
      pvVar1 = &DAT_00000001;
      pvVar2 = (iterator)0xd;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,0xb582b0,
                 (size_t)&local_2f8,0xbb,"result.end()","expected.begin()","expected.end()");
      boost::detail::shared_count::~shared_count(&local_f0);
      str_01._M_str = " 89 34 56 78";
      str_01._M_len = 0xc;
      TryParseHex<unsigned_char>
                ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 &with_embedded_null,str_01);
      if (with_embedded_null.field_2._M_local_buf[8] == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&result,&with_embedded_null);
        std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&with_embedded_null);
        local_308 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_300 = "";
        local_318 = &boost::unit_test::basic_cstring<char_const>::null;
        local_310 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_08.m_end = pvVar2;
        msg_08.m_begin = pvVar1;
        file_08.m_end = (iterator)0xbd;
        file_08.m_begin = (iterator)&local_308;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_318
                   ,msg_08);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        with_embedded_null._M_string_length._0_1_ = 0;
        with_embedded_null._M_dataplus._M_p = "<W\x1b";
        with_embedded_null.field_2._M_allocated_capacity =
             (size_type)boost::unit_test::lazy_ostream::inst;
        with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_328 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_320 = "";
        pvVar1 = &DAT_00000001;
        pvVar2 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,
                   0xb582b0,(size_t)&local_328,0xbd,"result.end()","expected.begin()",
                   "expected.end()");
        boost::detail::shared_count::~shared_count(&local_f0);
        with_embedded_null._M_dataplus._M_p._0_2_ = 0xaaff;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,
                   &with_embedded_null);
        hex_str_02._M_str = "     Ff        aA    ";
        hex_str_02._M_len = 0x15;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&with_embedded_null,
                   hex_str_02);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&result,&with_embedded_null);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &with_embedded_null);
        local_338 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_330 = "";
        local_348 = &boost::unit_test::basic_cstring<char_const>::null;
        local_340 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_09.m_end = pvVar2;
        msg_09.m_begin = pvVar1;
        file_09.m_end = (iterator)0xc2;
        file_09.m_begin = (iterator)&local_338;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_348
                   ,msg_09);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        with_embedded_null._M_string_length._0_1_ = 0;
        with_embedded_null._M_dataplus._M_p = "<W\x1b";
        with_embedded_null.field_2._M_allocated_capacity =
             (size_type)boost::unit_test::lazy_ostream::inst;
        with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_358 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_350 = "";
        pvVar1 = &DAT_00000001;
        pvVar2 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,
                   0xb582b0,(size_t)&local_358,0xc2,"result.end()","expected.begin()",
                   "expected.end()");
        boost::detail::shared_count::~shared_count(&local_f0);
        str_02._M_str = "     Ff        aA    ";
        str_02._M_len = 0x15;
        TryParseHex<unsigned_char>
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   &with_embedded_null,str_02);
        if (with_embedded_null.field_2._M_local_buf[8] == '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&result,&with_embedded_null);
          std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
          _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&with_embedded_null);
          local_368 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_360 = "";
          local_378 = &boost::unit_test::basic_cstring<char_const>::null;
          local_370 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_10.m_end = pvVar2;
          msg_10.m_begin = pvVar1;
          file_10.m_end = (iterator)0xc4;
          file_10.m_begin = (iterator)&local_368;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                     (size_t)&local_378,msg_10);
          boost::test_tools::tt_detail::equal_coll_impl::operator()
                    ((assertion_result *)local_100,(equal_coll_impl *)&local_560,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          with_embedded_null._M_string_length._0_1_ = 0;
          with_embedded_null._M_dataplus._M_p = "<W\x1b";
          with_embedded_null.field_2._M_allocated_capacity =
               (size_type)boost::unit_test::lazy_ostream::inst;
          with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
          local_388 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_380 = "";
          pvVar1 = &DAT_00000001;
          pvVar2 = (iterator)0xd;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_100,(lazy_ostream *)&with_embedded_null,1,0xd,4,
                     0xb582b0,(size_t)&local_388,0xc4,"result.end()","expected.begin()",
                     "expected.end()");
          boost::detail::shared_count::~shared_count(&local_f0);
          local_398 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_390 = "";
          local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_11.m_end = pvVar2;
          msg_11.m_begin = pvVar1;
          file_11.m_end = (iterator)0xc9;
          file_11.m_begin = (iterator)&local_398;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_3a8,msg_11);
          with_embedded_null._M_string_length._0_1_ = 0;
          with_embedded_null._M_dataplus._M_p = "<W\x1b";
          with_embedded_null.field_2._M_allocated_capacity =
               (size_type)boost::unit_test::lazy_ostream::inst;
          with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
          local_3b8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3b0 = "";
          util::hex_literals::operator___hex_v<util::hex_literals::detail::Hex<1UL>______>();
          local_560._0_8_ = CONCAT71(local_100._9_7_,local_100[8]) - local_100._0_8_;
          pppuVar3 = (undefined ***)&local_560;
          local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)0x0;
          local_540._1_3_ = 0;
          pvVar1 = (iterator)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                    (&with_embedded_null,&local_3b8,0xc9,1,2,pppuVar3,"\"\"_hex_v.size()",&local_540
                     ,"0");
          std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)local_100);
          local_3c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3c0 = "";
          local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_12.m_end = (iterator)pppuVar3;
          msg_12.m_begin = pvVar1;
          file_12.m_end = (iterator)0xca;
          file_12.m_begin = (iterator)&local_3c8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_3d8,msg_12);
          with_embedded_null._M_string_length._0_1_ = 0;
          with_embedded_null._M_dataplus._M_p = "<W\x1b";
          with_embedded_null.field_2._M_allocated_capacity =
               (size_type)boost::unit_test::lazy_ostream::inst;
          with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
          local_3e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3e0 = "";
          util::hex_literals::operator___hex_v_u8<util::hex_literals::detail::Hex<1UL>______>();
          local_560._0_8_ = CONCAT71(local_100._9_7_,local_100[8]) - local_100._0_8_;
          pppuVar3 = (undefined ***)&local_560;
          local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)0x0;
          local_540._1_3_ = 0;
          pvVar1 = (iterator)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                    (&with_embedded_null,&local_3e8,0xca,1,2,pppuVar3,"\"\"_hex_v_u8.size()",
                     &local_540,"0");
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
          local_3f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3f0 = "";
          local_408 = &boost::unit_test::basic_cstring<char_const>::null;
          local_400 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_13.m_end = (iterator)pppuVar3;
          msg_13.m_begin = pvVar1;
          file_13.m_end = (iterator)0xcb;
          file_13.m_begin = (iterator)&local_3f8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                     (size_t)&local_408,msg_13);
          with_embedded_null._M_string_length._0_1_ = 0;
          with_embedded_null._M_dataplus._M_p = "<W\x1b";
          with_embedded_null.field_2._M_allocated_capacity =
               (size_type)boost::unit_test::lazy_ostream::inst;
          with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
          local_418 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_410 = "";
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,
                     (string_view)(ZEXT816(0xc694e1) << 0x40));
          local_560._0_8_ = CONCAT71(local_100._9_7_,local_100[8]) - local_100._0_8_;
          pppuVar3 = (undefined ***)&local_560;
          local_540._0_8_ = (ulong)(uint)local_540._4_4_ << 0x20;
          pvVar1 = (iterator)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                    (&with_embedded_null,&local_418,0xcb,1,2,pppuVar3,"ParseHex(\"\").size()",
                     &local_540,"0");
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
          local_428 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_420 = "";
          local_438 = &boost::unit_test::basic_cstring<char_const>::null;
          local_430 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_14.m_end = (iterator)pppuVar3;
          msg_14.m_begin = pvVar1;
          file_14.m_end = (iterator)0xcc;
          file_14.m_begin = (iterator)&local_428;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_438,msg_14);
          with_embedded_null._M_string_length._0_1_ = 0;
          with_embedded_null._M_dataplus._M_p = "<W\x1b";
          with_embedded_null.field_2._M_allocated_capacity =
               (size_type)boost::unit_test::lazy_ostream::inst;
          with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
          local_448 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_440 = "";
          TryParseHex<unsigned_char>
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     local_100,(string_view)(ZEXT816(0xc694e1) << 0x40));
          if (local_e8._0_1_ == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_560._0_8_ = CONCAT71(local_100._9_7_,local_100[8]) - local_100._0_8_;
            pppuVar3 = (undefined ***)&local_560;
            local_540._0_8_ = local_540._0_8_ & 0xffffffff00000000;
            pvVar1 = (iterator)0x2;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (&with_embedded_null,&local_448,0xcc,1,2,pppuVar3,
                       "TryParseHex<uint8_t>(\"\").value().size()",&local_540,"0");
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_100);
            local_458 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_450 = "";
            local_468 = &boost::unit_test::basic_cstring<char_const>::null;
            local_460 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_15.m_end = (iterator)pppuVar3;
            msg_15.m_begin = pvVar1;
            file_15.m_end = (iterator)0xcf;
            file_15.m_begin = (iterator)&local_458;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                       (size_t)&local_468,msg_15);
            with_embedded_null._M_string_length._0_1_ = 0;
            with_embedded_null._M_dataplus._M_p = "<W\x1b";
            with_embedded_null.field_2._M_allocated_capacity =
                 (size_type)boost::unit_test::lazy_ostream::inst;
            with_embedded_null.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
            local_478 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_470 = "";
            hex_str_03._M_str = "AAF F";
            hex_str_03._M_len = 5;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,hex_str_03
                      );
            local_560._0_8_ = CONCAT71(local_100._9_7_,local_100[8]) - local_100._0_8_;
            pppuVar3 = (undefined ***)&local_560;
            local_540._0_8_ = local_540._0_8_ & 0xffffffff00000000;
            pvVar1 = (iterator)0x2;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (&with_embedded_null,&local_478,0xcf,1,2,pppuVar3,"ParseHex(\"AAF F\").size()"
                       ,&local_540,"0");
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
            local_488 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_480 = "";
            local_498 = &boost::unit_test::basic_cstring<char_const>::null;
            local_490 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_16.m_end = (iterator)pppuVar3;
            msg_16.m_begin = pvVar1;
            file_16.m_end = (iterator)0xd0;
            file_16.m_begin = (iterator)&local_488;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                       (size_t)&local_498,msg_16);
            _cVar4 = 0x58b995;
            str_03._M_str = "AAF F";
            str_03._M_len = 5;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
                       &with_embedded_null,str_03);
            local_560._0_8_ =
                 CONCAT71(local_560._1_7_,with_embedded_null.field_2._M_local_buf[8]) ^ 1;
            local_560.m_message.px = (element_type *)0x0;
            local_560.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_540._0_8_ = "!TryParseHex(\"AAF F\").has_value()";
            local_540.m_message.px = (element_type *)0xc68d23;
            local_100[8] = 0;
            local_100._0_8_ = &PTR__lazy_ostream_0113a070;
            local_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_4a8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4a0 = "";
            pvVar1 = &DAT_00000001;
            pvVar2 = (iterator)0x0;
            local_e8 = (char *)&local_540;
            boost::test_tools::tt_detail::report_assertion
                      (&local_560,(lazy_ostream *)local_100,1,0,WARN,_cVar4,(size_t)&local_4a8,0xd0)
            ;
            boost::detail::shared_count::~shared_count(&local_560.m_message.pn);
            std::_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>::
            _M_reset((_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
                     &with_embedded_null);
            s_abi_cxx11_(&with_embedded_null," 11  ",0xb);
            local_4b8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4b0 = "";
            local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_17.m_end = pvVar2;
            msg_17.m_begin = pvVar1;
            file_17.m_end = (iterator)0xd6;
            file_17.m_begin = (iterator)&local_4b8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                       (size_t)&local_4c8,msg_17);
            local_100[8] = 0;
            local_100._0_8_ = &PTR__lazy_ostream_01139f30;
            local_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = "";
            local_4d8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4d0 = "";
            local_560._0_8_ =
                 CONCAT71(with_embedded_null._M_string_length._1_7_,
                          (undefined1)with_embedded_null._M_string_length);
            pppuVar3 = (undefined ***)&local_560;
            local_540._0_4_ = 0xb;
            pvVar1 = (iterator)0x2;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (local_100,&local_4d8,0xd6,1,2,pppuVar3,"with_embedded_null.size()",&local_540
                       ,"11");
            local_4e8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4e0 = "";
            local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_18.m_end = (iterator)pppuVar3;
            msg_18.m_begin = pvVar1;
            file_18.m_end = (iterator)0xd7;
            file_18.m_begin = (iterator)&local_4e8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                       (size_t)&local_4f8,msg_18);
            local_100[8] = 0;
            local_100._0_8_ = &PTR__lazy_ostream_01139f30;
            local_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = "";
            local_508 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_500 = "";
            hex_str_04._M_len._1_7_ = with_embedded_null._M_string_length._1_7_;
            hex_str_04._M_len._0_1_ = (undefined1)with_embedded_null._M_string_length;
            hex_str_04._M_str = with_embedded_null._M_dataplus._M_p;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_560,
                       hex_str_04);
            local_540._0_8_ = (long)local_560.m_message.px - local_560._0_8_;
            pvVar1 = (iterator)&local_540;
            local_570 = (char *)((ulong)local_570._4_4_ << 0x20);
            pvVar2 = (iterator)0x2;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (local_100,&local_508,0xd7,1,2,pvVar1,"ParseHex(with_embedded_null).size()",
                       &local_570,"0");
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_560);
            local_518 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_510 = "";
            local_528 = &boost::unit_test::basic_cstring<char_const>::null;
            local_520 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_19.m_end = pvVar1;
            msg_19.m_begin = pvVar2;
            file_19.m_end = (iterator)0xd8;
            file_19.m_begin = (iterator)&local_518;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                       (size_t)&local_528,msg_19);
            str_04._M_len._1_7_ = with_embedded_null._M_string_length._1_7_;
            str_04._M_len._0_1_ = (undefined1)with_embedded_null._M_string_length;
            _cVar4 = 0x58bc35;
            str_04._M_str = with_embedded_null._M_dataplus._M_p;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_100,
                       str_04);
            local_540._0_8_ = CONCAT71(local_540._1_7_,local_e8._0_1_) ^ 1;
            local_540.m_message.px = (element_type *)0x0;
            local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_570 = "!TryParseHex(with_embedded_null).has_value()";
            local_568 = "";
            local_560.m_message.px =
                 (element_type *)((ulong)local_560.m_message.px & 0xffffffffffffff00);
            local_560._0_8_ = &PTR__lazy_ostream_0113a070;
            local_560.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_580 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_578 = "";
            pvVar1 = &DAT_00000001;
            pvVar2 = (iterator)0x0;
            local_548 = &local_570;
            boost::test_tools::tt_detail::report_assertion
                      (&local_540,(lazy_ostream *)&local_560,1,0,WARN,_cVar4,(size_t)&local_580,0xd8
                      );
            boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
            std::_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>::
            _M_reset((_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
                     local_100);
            local_590 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_588 = "";
            local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_598 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_20.m_end = pvVar2;
            msg_20.m_begin = pvVar1;
            file_20.m_end = (iterator)0xdb;
            file_20.m_begin = (iterator)&local_590;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                       (size_t)&local_5a0,msg_20);
            local_100[8] = 0;
            local_100._0_8_ = &PTR__lazy_ostream_01139f30;
            local_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = "";
            local_5b0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5a8 = "";
            hex_str_05._M_str = "1234 invalid 1234";
            hex_str_05._M_len = 0x11;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_560,
                       hex_str_05);
            local_540._0_8_ = (long)local_560.m_message.px - local_560._0_8_;
            pvVar1 = (iterator)&local_540;
            local_570 = (char *)((ulong)local_570 & 0xffffffff00000000);
            pvVar2 = (iterator)0x2;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (local_100,&local_5b0,0xdb,1,2,pvVar1,"ParseHex(\"1234 invalid 1234\").size()"
                       ,&local_570,"0");
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_560);
            local_5c0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5b8 = "";
            local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_21.m_end = pvVar1;
            msg_21.m_begin = pvVar2;
            file_21.m_end = (iterator)0xdc;
            file_21.m_begin = (iterator)&local_5c0;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                       (size_t)&local_5d0,msg_21);
            _cVar4 = 0x58bdfe;
            str_05._M_str = "1234 invalid 1234";
            str_05._M_len = 0x11;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_100,
                       str_05);
            local_540._0_8_ = CONCAT71(local_540._1_7_,local_e8._0_1_) ^ 1;
            local_540.m_message.px = (element_type *)0x0;
            local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_570 = "!TryParseHex(\"1234 invalid 1234\").has_value()";
            local_568 = "";
            local_560.m_message.px =
                 (element_type *)((ulong)local_560.m_message.px & 0xffffffffffffff00);
            local_560._0_8_ = &PTR__lazy_ostream_0113a070;
            local_560.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_5e0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5d8 = "";
            pvVar1 = &DAT_00000001;
            pvVar2 = (iterator)0x0;
            local_548 = &local_570;
            boost::test_tools::tt_detail::report_assertion
                      (&local_540,(lazy_ostream *)&local_560,1,0,WARN,_cVar4,(size_t)&local_5e0,0xdc
                      );
            boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
            std::_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>::
            _M_reset((_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
                     local_100);
            local_5f0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5e8 = "";
            local_600 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_22.m_end = pvVar2;
            msg_22.m_begin = pvVar1;
            file_22.m_end = (iterator)0xdf;
            file_22.m_begin = (iterator)&local_5f0;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                       (size_t)&local_600,msg_22);
            local_100[8] = 0;
            local_100._0_8_ = &PTR__lazy_ostream_01139f30;
            local_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = "";
            local_610 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_608 = "";
            hex_str_06._M_str = "12 3";
            hex_str_06._M_len = 4;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_560,
                       hex_str_06);
            local_540._0_8_ = (long)local_560.m_message.px - local_560._0_8_;
            pvVar1 = (iterator)&local_540;
            local_570 = (char *)((ulong)local_570 & 0xffffffff00000000);
            pvVar2 = (iterator)0x2;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (local_100,&local_610,0xdf,1,2,pvVar1,"ParseHex(\"12 3\").size()",&local_570,
                       "0");
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_560);
            local_620 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_618 = "";
            local_630 = &boost::unit_test::basic_cstring<char_const>::null;
            local_628 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_23.m_end = pvVar1;
            msg_23.m_begin = pvVar2;
            file_23.m_end = (iterator)0xe0;
            file_23.m_begin = (iterator)&local_620;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,
                       (size_t)&local_630,msg_23);
            _cVar4 = 0x58bfb2;
            str_06._M_str = "12 3";
            str_06._M_len = 4;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_100,
                       str_06);
            local_540._0_8_ = CONCAT71(local_540._1_7_,local_e8._0_1_) ^ 1;
            local_540.m_message.px = (element_type *)0x0;
            local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_570 = "!TryParseHex(\"12 3\").has_value()";
            local_568 = "";
            local_560.m_message.px =
                 (element_type *)((ulong)local_560.m_message.px & 0xffffffffffffff00);
            local_560._0_8_ = &PTR__lazy_ostream_0113a070;
            local_560.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_640 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_638 = "";
            local_548 = &local_570;
            boost::test_tools::tt_detail::report_assertion
                      (&local_540,(lazy_ostream *)&local_560,1,0,WARN,_cVar4,(size_t)&local_640,0xe0
                      );
            boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
            std::_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>::
            _M_reset((_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
                     local_100);
            std::__cxx11::string::~string((string *)&with_embedded_null);
            std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                      (&hex_literal_vector.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                      );
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_hex)
{
    std::vector<unsigned char> result;

    // Basic test vector
    std::vector<unsigned char> expected(std::begin(HEX_PARSE_OUTPUT), std::end(HEX_PARSE_OUTPUT));
    constexpr std::array<std::byte, 65> hex_literal_array{operator""_hex<util::detail::Hex(HEX_PARSE_INPUT)>()};
    auto hex_literal_span{MakeUCharSpan(hex_literal_array)};
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_span.begin(), hex_literal_span.end(), expected.begin(), expected.end());

    const std::vector<std::byte> hex_literal_vector{operator""_hex_v<util::detail::Hex(HEX_PARSE_INPUT)>()};
    hex_literal_span = MakeUCharSpan(hex_literal_vector);
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_span.begin(), hex_literal_span.end(), expected.begin(), expected.end());

    constexpr std::array<uint8_t, 65> hex_literal_array_uint8{operator""_hex_u8<util::detail::Hex(HEX_PARSE_INPUT)>()};
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_array_uint8.begin(), hex_literal_array_uint8.end(), expected.begin(), expected.end());

    result = operator""_hex_v_u8<util::detail::Hex(HEX_PARSE_INPUT)>();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    result = ParseHex(HEX_PARSE_INPUT);
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    result = TryParseHex<uint8_t>(HEX_PARSE_INPUT).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Spaces between bytes must be supported
    expected = {0x12, 0x34, 0x56, 0x78};
    result = ParseHex("12 34 56 78");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>("12 34 56 78").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Leading space must be supported (used in BerkeleyEnvironment::Salvage)
    expected = {0x89, 0x34, 0x56, 0x78};
    result = ParseHex(" 89 34 56 78");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>(" 89 34 56 78").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Mixed case and spaces are supported
    expected = {0xff, 0xaa};
    result = ParseHex("     Ff        aA    ");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>("     Ff        aA    ").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Empty string is supported
    static_assert(""_hex.empty());
    static_assert(""_hex_u8.empty());
    BOOST_CHECK_EQUAL(""_hex_v.size(), 0);
    BOOST_CHECK_EQUAL(""_hex_v_u8.size(), 0);
    BOOST_CHECK_EQUAL(ParseHex("").size(), 0);
    BOOST_CHECK_EQUAL(TryParseHex<uint8_t>("").value().size(), 0);

    // Spaces between nibbles is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("AAF F").size(), 0);
    BOOST_CHECK(!TryParseHex("AAF F").has_value());

    // Embedded null is treated as invalid
    const std::string with_embedded_null{" 11 "s
                                         " \0 "
                                         " 22 "s};
    BOOST_CHECK_EQUAL(with_embedded_null.size(), 11);
    BOOST_CHECK_EQUAL(ParseHex(with_embedded_null).size(), 0);
    BOOST_CHECK(!TryParseHex(with_embedded_null).has_value());

    // Non-hex is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("1234 invalid 1234").size(), 0);
    BOOST_CHECK(!TryParseHex("1234 invalid 1234").has_value());

    // Truncated input is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("12 3").size(), 0);
    BOOST_CHECK(!TryParseHex("12 3").has_value());
}